

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O0

int Io_WriteMoPlaOneIntMintermsM(FILE *pFile,Abc_Ntk_t *pNtk,DdManager *dd,DdNode *bFunc,int nMints)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *array;
  DdNode **__ptr;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  int local_50;
  int nInputs;
  int k;
  int i;
  DdNode **pbMints;
  int *pArray;
  Abc_Obj_t *pNode;
  int nMints_local;
  DdNode *bFunc_local;
  DdManager *dd_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  array = (int *)calloc((long)dd->size,4);
  __ptr = Cudd_bddPickArbitraryMinterms(dd,bFunc,dd->vars,dd->size,nMints);
  uVar1 = Abc_NtkCiNum(pNtk);
  iVar3 = dd->size;
  iVar2 = Abc_NtkCiNum(pNtk);
  if (iVar3 == iVar2) {
    fprintf((FILE *)pFile,".i %d\n",(ulong)uVar1);
    fprintf((FILE *)pFile,".o %d\n",1);
    fprintf((FILE *)pFile,".ilb");
    for (nInputs = 0; iVar3 = Abc_NtkCiNum(pNtk), nInputs < iVar3; nInputs = nInputs + 1) {
      pAVar4 = Abc_NtkCi(pNtk,nInputs);
      pcVar5 = Abc_ObjName(pAVar4);
      fprintf((FILE *)pFile," %s",pcVar5);
    }
    fprintf((FILE *)pFile,"\n");
    fprintf((FILE *)pFile,".ob");
    pAVar4 = Abc_NtkCo(pNtk,0);
    pcVar5 = Abc_ObjName(pAVar4);
    fprintf((FILE *)pFile," %s",pcVar5);
    fprintf((FILE *)pFile,"\n");
    fprintf((FILE *)pFile,".p %d\n",(ulong)(uint)nMints);
    for (local_50 = 0; local_50 < nMints; local_50 = local_50 + 1) {
      Cudd_BddToCubeArray(dd,__ptr[local_50],array);
      for (nInputs = 0; iVar3 = Abc_NtkCiNum(pNtk), nInputs < iVar3; nInputs = nInputs + 1) {
        if (array[nInputs] == 0) {
          fprintf((FILE *)pFile,"%c",0x30);
        }
        else if (array[nInputs] == 1) {
          fprintf((FILE *)pFile,"%c",0x31);
        }
        else if (array[nInputs] == 2) {
          fprintf((FILE *)pFile,"%c",0x2d);
        }
      }
      fprintf((FILE *)pFile," ");
      fprintf((FILE *)pFile,"%c",0x31);
      fprintf((FILE *)pFile,"\n");
    }
    fprintf((FILE *)pFile,".e\n");
    if (__ptr != (DdNode **)0x0) {
      free(__ptr);
    }
    if (array != (int *)0x0) {
      free(array);
    }
    return 1;
  }
  __assert_fail("dd->size == Abc_NtkCiNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                ,0x1d3,
                "int Io_WriteMoPlaOneIntMintermsM(FILE *, Abc_Ntk_t *, DdManager *, DdNode *, int)")
  ;
}

Assistant:

int Io_WriteMoPlaOneIntMintermsM( FILE * pFile, Abc_Ntk_t * pNtk, DdManager * dd, DdNode * bFunc, int nMints )
{
    Abc_Obj_t * pNode;
    int * pArray = ABC_CALLOC( int, dd->size );
    DdNode ** pbMints = Cudd_bddPickArbitraryMinterms( dd, bFunc, dd->vars, dd->size, nMints );
    int i, k, nInputs = Abc_NtkCiNum(pNtk);
    assert( dd->size == Abc_NtkCiNum(pNtk) );

    // write the header
    fprintf( pFile, ".i %d\n", nInputs );
    fprintf( pFile, ".o %d\n", 1 );
    fprintf( pFile, ".ilb" );
    Abc_NtkForEachCi( pNtk, pNode, i )
        fprintf( pFile, " %s", Abc_ObjName(pNode) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".ob" );
    fprintf( pFile, " %s", Abc_ObjName(Abc_NtkCo(pNtk, 0)) );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".p %d\n", nMints );

    // iterate through minterms
    for ( k = 0; k < nMints; k++ )
    {
        Cudd_BddToCubeArray( dd, pbMints[k], pArray );
        for ( i = 0; i < Abc_NtkCiNum(pNtk); i++ )
            if ( pArray[i] == 0 )
                fprintf( pFile, "%c", '0' );
            else if ( pArray[i] == 1 )
                fprintf( pFile, "%c", '1' );
            else if ( pArray[i] == 2 )
                fprintf( pFile, "%c", '-' );
        fprintf( pFile, " " );
        fprintf( pFile, "%c", '1' );
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, ".e\n" );

    //for ( k = 0; k < nMints; k++ )
    //    Cudd_RecursiveDeref( dd, pbMints[k] );
    ABC_FREE( pbMints );
    ABC_FREE( pArray );
    return 1;
}